

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

void ZSTD_updateDUBT(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls)

{
  uint uVar1;
  U32 UVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  char *__assertion;
  ulong uVar9;
  ulong uVar10;
  
  uVar7 = (ms->cParams).chainLog;
  if (iend < ip + 8) {
    __assertion = "ip + 8 <= iend";
    uVar7 = 0x2a;
  }
  else {
    uVar10 = (ulong)ms->nextToUpdate;
    if ((ms->window).dictLimit <= ms->nextToUpdate) {
      pBVar3 = (ms->window).base;
      pUVar4 = ms->hashTable;
      uVar1 = (ms->cParams).hashLog;
      pUVar5 = ms->chainTable;
      cVar6 = (char)uVar1;
      do {
        if (((long)ip - (long)pBVar3 & 0xffffffffU) <= uVar10) {
          ms->nextToUpdate = (U32)((long)ip - (long)pBVar3);
          return;
        }
        if (0x20 < uVar1) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        switch(mls) {
        case 5:
          uVar8 = *(long *)(pBVar3 + uVar10) * -0x30e4432345000000;
          break;
        case 6:
          uVar8 = *(long *)(pBVar3 + uVar10) * -0x30e4432340650000;
          break;
        case 7:
          uVar8 = *(long *)(pBVar3 + uVar10) * -0x30e44323405a9d00;
          break;
        case 8:
          uVar8 = *(long *)(pBVar3 + uVar10) * -0x30e44323485a9b9d;
          break;
        default:
          uVar8 = (ulong)((uint)(*(int *)(pBVar3 + uVar10) * -0x61c8864f) >> (0x20U - cVar6 & 0x1f))
          ;
          goto LAB_006c32fa;
        }
        uVar8 = uVar8 >> (0x40U - cVar6 & 0x3f);
LAB_006c32fa:
        UVar2 = pUVar4[uVar8];
        uVar9 = (ulong)(((uint)uVar10 & ~(-1 << ((char)uVar7 - 1U & 0x1f))) * 2);
        pUVar4[uVar8] = (uint)uVar10;
        pUVar5[uVar9] = UVar2;
        pUVar5[uVar9 + 1] = 1;
        uVar10 = uVar10 + 1;
      } while( true );
    }
    __assertion = "idx >= ms->window.dictLimit";
    uVar7 = 0x2d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                ,uVar7,"void ZSTD_updateDUBT(ZSTD_matchState_t *, const BYTE *, const BYTE *, U32)")
  ;
}

Assistant:

static void
ZSTD_updateDUBT(ZSTD_matchState_t* ms,
                const BYTE* ip, const BYTE* iend,
                U32 mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hashLog = cParams->hashLog;

    U32* const bt = ms->chainTable;
    U32  const btLog  = cParams->chainLog - 1;
    U32  const btMask = (1 << btLog) - 1;

    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    if (idx != target)
        DEBUGLOG(7, "ZSTD_updateDUBT, from %u to %u (dictLimit:%u)",
                    idx, target, ms->window.dictLimit);
    assert(ip + 8 <= iend);   /* condition for ZSTD_hashPtr */
    (void)iend;

    assert(idx >= ms->window.dictLimit);   /* condition for valid base+idx */
    for ( ; idx < target ; idx++) {
        size_t const h  = ZSTD_hashPtr(base + idx, hashLog, mls);   /* assumption : ip + 8 <= iend */
        U32    const matchIndex = hashTable[h];

        U32*   const nextCandidatePtr = bt + 2*(idx&btMask);
        U32*   const sortMarkPtr  = nextCandidatePtr + 1;

        DEBUGLOG(8, "ZSTD_updateDUBT: insert %u", idx);
        hashTable[h] = idx;   /* Update Hash Table */
        *nextCandidatePtr = matchIndex;   /* update BT like a chain */
        *sortMarkPtr = ZSTD_DUBT_UNSORTED_MARK;
    }
    ms->nextToUpdate = target;
}